

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_observe_multiple_test_total_sum_Test::TestBody
          (HistogramTest_observe_multiple_test_total_sum_Test *this)

{
  allocator<double> *this_00;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_268;
  Message local_260;
  int local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_1;
  Message local_238;
  uint local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  Histogram h;
  ClientMetric metric;
  double local_158 [4];
  iterator local_138;
  size_type local_130;
  vector<double,_std::allocator<double>_> local_128;
  allocator<double> local_109;
  double local_108 [4];
  iterator local_e8;
  size_type local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  allocator<double> local_a9;
  double local_a8 [2];
  iterator local_98;
  size_type local_90;
  vector<double,_std::allocator<double>_> local_88;
  undefined1 local_70 [8];
  Histogram histogram;
  HistogramTest_observe_multiple_test_total_sum_Test *this_local;
  
  local_a8[0] = 1.0;
  local_a8[1] = 2.0;
  local_98 = local_a8;
  local_90 = 2;
  histogram.sum_.value_._M_i = (atomic<double>)(atomic<double>)this;
  std::allocator<double>::allocator(&local_a9);
  __l_01._M_len = local_90;
  __l_01._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__l_01,&local_a9);
  Histogram::Histogram((Histogram *)local_70,&local_88);
  std::vector<double,_std::allocator<double>_>::~vector(&local_88);
  std::allocator<double>::~allocator(&local_a9);
  local_108[2] = 3.0;
  local_108[0] = 5.0;
  local_108[1] = 9.0;
  local_e8 = local_108;
  local_e0 = 3;
  std::allocator<double>::allocator(&local_109);
  __l_00._M_len = local_e0;
  __l_00._M_array = local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_d8,__l_00,&local_109);
  Histogram::ObserveMultiple((Histogram *)local_70,&local_d8,20.0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_d8);
  std::allocator<double>::~allocator(&local_109);
  local_158[2] = 6.0;
  local_158[0] = 0.0;
  local_158[1] = 20.0;
  local_138 = local_158;
  local_130 = 3;
  this_00 = (allocator<double> *)((long)&metric.timestamp_ms + 7);
  std::allocator<double>::allocator(this_00);
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::vector<double,_std::allocator<double>_>::vector(&local_128,__l,this_00);
  Histogram::ObserveMultiple((Histogram *)local_70,&local_128,34.0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_128);
  std::allocator<double>::~allocator((allocator<double> *)((long)&metric.timestamp_ms + 7));
  Histogram::Collect((ClientMetric *)
                     &h.bucket.
                      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Histogram *)local_70);
  ClientMetric::Histogram::Histogram
            ((Histogram *)&gtest_ar.message_,
             (Histogram *)
             &metric.summary.quantile.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_22c = 0x2b;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_228,"h.sample_count","43U",(unsigned_long *)&gtest_ar.message_,
             &local_22c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_254 = 0x36;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_250,"h.sample_sum","54",(double *)&h,&local_254);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  ClientMetric::Histogram::~Histogram((Histogram *)&gtest_ar.message_);
  ClientMetric::~ClientMetric
            ((ClientMetric *)
             &h.bucket.
              super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Histogram::~Histogram((Histogram *)local_70);
  return;
}

Assistant:

TEST(HistogramTest, observe_multiple_test_total_sum) {
  Histogram histogram{{1, 2}};
  histogram.ObserveMultiple({5, 9, 3}, 20);
  histogram.ObserveMultiple({0, 20, 6}, 34);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_count, 43U);
  EXPECT_EQ(h.sample_sum, 54);
}